

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int mem_av_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  int iVar1;
  int iVar2;
  bitmap_t dst;
  ulong uVar3;
  bitmap_el_t *__s2;
  VARR_mem_expr_t *pVVar4;
  MIR_insn_t pMVar5;
  bitmap_t bm;
  int iVar6;
  int iVar7;
  size_t sVar8;
  bitmap_t pVVar9;
  size_t sVar10;
  bitmap_t pVVar11;
  const_bitmap_t mem2;
  const_bitmap_t nb;
  const_bitmap_t pVVar12;
  MIR_insn_t mem1;
  ulong uVar13;
  ulong uVar14;
  
  dst = gen_ctx->temp_bitmap;
  bitmap_copy(dst,bb->out);
  pVVar9 = bb->out;
  mem2 = bb->gen;
  bitmap_copy(pVVar9,mem2);
  if (bb->call_p == '\0') {
    pVVar9 = bb->in;
    pVVar11 = pVVar9;
    if (pVVar9 == (bitmap_t)0x0) goto LAB_00165c05;
    sVar8 = pVVar9->els_num;
    if (sVar8 != 0) {
      sVar10 = 0;
      nb = (const_bitmap_t)0x0;
      do {
        while ((mem2 = (const_bitmap_t)pVVar9->varr[sVar10], mem2 == (const_bitmap_t)0x0 ||
               (mem2 = (const_bitmap_t)((ulong)mem2 >> ((ulong)nb & 0x3f)),
               mem2 == (const_bitmap_t)0x0))) {
          sVar10 = sVar10 + 1;
          nb = (const_bitmap_t)(sVar10 * 0x40);
          if (sVar8 == sVar10) goto LAB_001659ab;
        }
        uVar14 = (ulong)mem2 & 1;
        pVVar12 = nb;
        while (uVar14 == 0) {
          pVVar12 = (const_bitmap_t)((long)&pVVar12->els_num + 1);
          uVar14 = (ulong)mem2 & 2;
          mem2 = (const_bitmap_t)((ulong)mem2 >> 1);
        }
        pVVar4 = gen_ctx->gvn_ctx->mem_exprs;
        if (((pVVar4 == (VARR_mem_expr_t *)0x0) || (pVVar4->varr == (mem_expr_t *)0x0)) ||
           ((const_bitmap_t)pVVar4->els_num <= pVVar12)) goto LAB_00165c00;
        pVVar11 = bb->gen;
        pMVar5 = pVVar4->varr[(long)pVVar12]->insn;
        mem1 = pMVar5 + 1;
        if (pMVar5->ops[0].field_0x8 == '\v') {
          mem1 = (MIR_insn_t)pMVar5->ops;
        }
        if (pVVar11 == (bitmap_t)0x0) goto LAB_00165c0f;
        sVar8 = pVVar11->els_num;
        nb = (const_bitmap_t)((long)&pVVar12->els_num + 1);
        if (sVar8 != 0) {
          sVar10 = 0;
          uVar14 = 0;
          do {
            while ((pVVar11->varr[sVar10] == 0 ||
                   (mem2 = (const_bitmap_t)(pVVar11->varr[sVar10] >> (uVar14 & 0x3f)),
                   mem2 == (const_bitmap_t)0x0))) {
              sVar10 = sVar10 + 1;
              uVar14 = sVar10 * 0x40;
              if (sVar8 == sVar10) goto LAB_00165ba6;
            }
            uVar3 = (ulong)mem2 & 1;
            while (uVar3 == 0) {
              uVar14 = uVar14 + 1;
              uVar3 = (ulong)mem2 & 2;
              mem2 = (const_bitmap_t)((ulong)mem2 >> 1);
            }
            pVVar4 = gen_ctx->gvn_ctx->mem_exprs;
            if (((pVVar4 == (VARR_mem_expr_t *)0x0) || (pVVar4->varr == (mem_expr_t *)0x0)) ||
               (pVVar4->els_num <= uVar14)) goto LAB_00165c0a;
            pMVar5 = pVVar4->varr[uVar14]->insn;
            if (pMVar5->ops[0].field_0x8 == '\v') {
              mem2 = (const_bitmap_t)pMVar5->ops;
              iVar6 = may_mem_alias_p((MIR_op_t *)mem1,(MIR_op_t *)mem2);
              if (iVar6 != 0) goto LAB_00165bd9;
            }
            sVar8 = pVVar11->els_num;
            uVar14 = uVar14 + 1;
            sVar10 = uVar14 >> 6;
          } while (sVar10 < sVar8);
        }
LAB_00165ba6:
        bm = bb->out;
        mem2 = nb;
        pVVar11 = bm;
        bitmap_expand(bm,(size_t)nb);
        if (bm == (bitmap_t)0x0) goto LAB_00165c14;
        bm->varr[(ulong)pVVar12 >> 6] =
             bm->varr[(ulong)pVVar12 >> 6] | 1L << ((ulong)pVVar12 & 0x3f);
LAB_00165bd9:
        sVar10 = (ulong)nb >> 6;
        sVar8 = pVVar9->els_num;
      } while (sVar10 < sVar8);
    }
  }
LAB_001659ab:
  pVVar11 = bb->out;
  if (pVVar11 == (bitmap_t)0x0) {
    mem_av_trans_func_cold_6();
  }
  else if (dst != (bitmap_t)0x0) {
    uVar14 = pVVar11->els_num;
    uVar3 = dst->els_num;
    pVVar9 = dst;
    uVar13 = uVar3;
    if (uVar3 < uVar14) {
      pVVar9 = pVVar11;
      pVVar11 = dst;
      uVar13 = uVar14;
      uVar14 = uVar3;
    }
    __s2 = pVVar9->varr;
    iVar6 = bcmp(pVVar11->varr,__s2,uVar14 * 8);
    iVar7 = 1;
    if (iVar6 == 0) {
      if (uVar14 < uVar13) {
        do {
          if (__s2[uVar14] != 0) {
            return 1;
          }
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
      iVar7 = 0;
    }
    return iVar7;
  }
  mem_av_trans_func_cold_5();
LAB_00165c00:
  mem_av_trans_func_cold_4();
  pVVar11 = pVVar9;
LAB_00165c05:
  mem_av_trans_func_cold_7();
LAB_00165c0a:
  mem_av_trans_func_cold_1();
LAB_00165c0f:
  mem_av_trans_func_cold_3();
LAB_00165c14:
  mem_av_trans_func_cold_2();
  if (((char)pVVar11->size != '\v') || ((char)mem2->size != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  iVar6 = *(int *)((long)&pVVar11->varr + 4);
  iVar7 = (int)pVVar11[1].els_num;
  iVar1 = *(int *)((long)&mem2->varr + 4);
  iVar2 = (int)mem2[1].els_num;
  if ((((iVar6 == iVar1) || (iVar6 == 0)) || (iVar6 = 0, iVar1 == 0)) &&
     (iVar6 = 1, iVar2 != 0 && iVar7 != 0)) {
    return (int)(iVar7 != iVar2);
  }
  return iVar6;
}

Assistant:

static int mem_av_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  int alias_p;
  size_t nel, nel2;
  MIR_insn_t insn, mem_insn;
  MIR_op_t *mem_ref;
  bitmap_iterator_t bi, bi2;
  bitmap_t prev_mem_av_out = temp_bitmap;

  bitmap_copy (prev_mem_av_out, bb->mem_av_out);
  bitmap_copy (bb->mem_av_out, bb->gen);
  if (!bb->call_p) {
    FOREACH_BITMAP_BIT (bi, bb->mem_av_in, nel) {
      alias_p = FALSE;
      insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
      mem_ref = insn->ops[0].mode == MIR_OP_VAR_MEM ? &insn->ops[0] : &insn->ops[1];
      FOREACH_BITMAP_BIT (bi2, bb->gen, nel2) { /* consider only stores */
        mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel2)->insn;
        if (mem_insn->ops[0].mode == MIR_OP_VAR_MEM
            && may_mem_alias_p (mem_ref, &mem_insn->ops[0])) {
          alias_p = TRUE;
          break;
        }
      }
      if (!alias_p) bitmap_set_bit_p (bb->mem_av_out, nel);
    }
  }
  return !bitmap_equal_p (bb->mem_av_out, prev_mem_av_out);
}